

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::IsFortranBuildingInstrinsicModules(cmGeneratorTarget *this)

{
  byte bVar1;
  cmValue cVar2;
  char *extraout_RDX;
  string_view value;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Fortran_BUILDING_INSTRINSIC_MODULES",&local_31);
  cVar2 = GetProperty(this,&local_30);
  bVar1 = std::__cxx11::string::~string((string *)&local_30);
  if (cVar2.Value != (string *)0x0) {
    value._M_str = extraout_RDX;
    value._M_len = (size_t)((cVar2.Value)->_M_dataplus)._M_p;
    bVar1 = cmValue::IsOn((cmValue *)(cVar2.Value)->_M_string_length,value);
  }
  return (bool)(cVar2.Value != (string *)0x0 & bVar1);
}

Assistant:

bool cmGeneratorTarget::IsFortranBuildingInstrinsicModules() const
{
  if (cmValue prop =
        this->GetProperty("Fortran_BUILDING_INSTRINSIC_MODULES")) {
    return cmIsOn(*prop);
  }
  return false;
}